

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O0

void __thiscall UdpBitDht::findDhtValue(UdpBitDht *this,bdNodeId *id,string *key,uint32_t mode)

{
  bdNodeManager *pbVar1;
  string local_50 [32];
  bdStackMutex local_30;
  bdStackMutex stack;
  uint32_t mode_local;
  string *key_local;
  bdNodeId *id_local;
  UdpBitDht *this_local;
  
  stack.mMtx._4_4_ = mode;
  bdStackMutex::bdStackMutex(&local_30,&this->dhtMtx);
  pbVar1 = this->mBitDhtManager;
  std::__cxx11::string::string(local_50,(string *)key);
  (*(pbVar1->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher[10])
            (pbVar1,id,local_50,(ulong)stack.mMtx._4_4_);
  std::__cxx11::string::~string(local_50);
  bdStackMutex::~bdStackMutex(&local_30);
  return;
}

Assistant:

void UdpBitDht::findDhtValue(bdNodeId *id, std::string key, uint32_t mode) {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	mBitDhtManager->findDhtValue(id, key, mode);
}